

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserFontEffect.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserFontEffect::ParseValue
          (PropertyParserFontEffect *this,Property *property,String *font_effect_string_value,
          ParameterMap *param_3)

{
  pointer *this_00;
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  size_type __n;
  reference pbVar4;
  ulong uVar5;
  undefined8 uVar6;
  PropertyMap *this_01;
  element_type *this_02;
  const_iterator cVar7;
  bool local_2a9;
  undefined1 local_2a0 [56];
  shared_ptr<const_Rml::FontEffect> *local_268;
  shared_ptr<const_Rml::FontEffect> *local_258;
  shared_ptr<const_Rml::FontEffect> *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  reference local_228;
  pair<Rml::PropertyId,_Rml::Property> *id_value;
  const_iterator __end4;
  const_iterator __begin4;
  PropertyMap *__range4;
  size_t local_1f0;
  size_t fingerprint;
  SharedPtr<FontEffect> font_effect;
  allocator<char> local_1b1;
  String local_1b0;
  undefined1 local_190 [8];
  PropertyDictionary properties;
  PropertySpecification *specification;
  String shorthand;
  FontEffectInstancer *instancer;
  undefined1 local_110 [8];
  String type;
  bool invalid_parenthesis;
  size_t shorthand_close;
  size_t shorthand_open;
  String *font_effect_string;
  iterator __end1;
  iterator __begin1;
  StringList *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8 [8];
  StringList font_effect_string_list;
  FontEffects font_effects;
  ParameterMap *param_4_local;
  String *font_effect_string_value_local;
  Property *property_local;
  PropertyParserFontEffect *this_local;
  
  uVar3 = ::std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) || (bVar1 = ::std::operator==(font_effect_string_value,"none"), bVar1)) {
    Variant::Variant((Variant *)((long)&font_effects.value.field_2 + 8));
    Variant::operator=(&property->value,(Variant *)((long)&font_effects.value.field_2 + 8));
    Variant::~Variant((Variant *)((long)&font_effects.value.field_2 + 8));
    property->unit = UNKNOWN;
    this_local._7_1_ = 1;
  }
  else {
    FontEffects::FontEffects
              ((FontEffects *)
               &font_effect_string_list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_a8);
    StringUtilities::ExpandString((StringList *)local_a8,font_effect_string_value,',','(',')',false)
    ;
    ::std::__cxx11::string::operator=
              ((string *)
               &font_effects.list.
                super__Vector_base<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)font_effect_string_value);
    __n = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_a8);
    ::std::
    vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
    ::reserve((vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
               *)&font_effect_string_list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,__n);
    __end1 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_a8);
    font_effect_string =
         (String *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_a8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&font_effect_string), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      uVar3 = ::std::__cxx11::string::find((char)pbVar4,0x28);
      uVar5 = ::std::__cxx11::string::rfind((char)pbVar4,0x29);
      local_2a9 = true;
      if ((uVar3 != 0xffffffffffffffff) && (local_2a9 = true, uVar5 != 0xffffffffffffffff)) {
        local_2a9 = uVar5 <= uVar3;
      }
      type.field_2._M_local_buf[0xf] = local_2a9;
      if (local_2a9 != false) {
        uVar6 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Invalid syntax for font-effect \'%s\'.",uVar6);
        this_local._7_1_ = 0;
        type.field_2._8_4_ = 1;
        goto LAB_005f0e2e;
      }
      ::std::__cxx11::string::substr((ulong)&instancer,(ulong)pbVar4);
      StringUtilities::StripWhitespace((String *)local_110,(String *)&instancer);
      ::std::__cxx11::string::~string((string *)&instancer);
      shorthand.field_2._8_8_ = Factory::GetFontEffectInstancer((String *)local_110);
      if ((FontEffectInstancer *)shorthand.field_2._8_8_ == (FontEffectInstancer *)0x0) {
        uVar6 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Font-effect type \'%s\' not found.",uVar6);
        this_local._7_1_ = 0;
        type.field_2._8_4_ = 1;
      }
      else {
        ::std::__cxx11::string::substr((ulong)&specification,(ulong)pbVar4);
        properties.properties._40_8_ =
             FontEffectInstancer::GetPropertySpecification
                       ((FontEffectInstancer *)shorthand.field_2._8_8_);
        PropertyDictionary::PropertyDictionary((PropertyDictionary *)local_190);
        uVar6 = properties.properties._40_8_;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"font-effect",&local_1b1);
        bVar1 = PropertySpecification::ParsePropertyDeclaration
                          ((PropertySpecification *)uVar6,(PropertyDictionary *)local_190,&local_1b0
                           ,(String *)&specification);
        ::std::__cxx11::string::~string((string *)&local_1b0);
        ::std::allocator<char>::~allocator(&local_1b1);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_005f0a67:
          PropertySpecification::SetPropertyDefaults
                    ((PropertySpecification *)properties.properties._40_8_,
                     (PropertyDictionary *)local_190);
          (**(code **)(*(long *)shorthand.field_2._8_8_ + 0x10))
                    (&fingerprint,shorthand.field_2._8_8_,local_110,local_190);
          bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&fingerprint);
          if (bVar1) {
            local_1f0 = ::std::
                        hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)((long)&__range4 + 7),(string *)local_110);
            this_01 = PropertyDictionary::GetProperties((PropertyDictionary *)local_190);
            cVar7 = robin_hood::detail::
                    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                    ::begin(this_01);
            __end4.mInfo = (uint8_t *)cVar7.mKeyVals;
            cVar7 = robin_hood::detail::
                    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                    ::end(this_01);
            while( true ) {
              __end4.mKeyVals = (NodePtr)cVar7.mInfo;
              id_value = &(cVar7.mKeyVals)->mData;
              bVar1 = robin_hood::detail::
                      Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
                      ::Iter<true>::operator!=((Iter<true> *)&__end4.mInfo,(Iter<true> *)&id_value);
              if (!bVar1) break;
              local_228 = robin_hood::detail::
                          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                          ::Iter<true>::operator*((Iter<true> *)&__end4.mInfo);
              Property::Get<std::__cxx11::string>(&local_248,&local_228->second);
              Utilities::HashCombine<std::__cxx11::string>(&local_1f0,&local_248);
              ::std::__cxx11::string::~string((string *)&local_248);
              robin_hood::detail::
              Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
              ::Iter<true>::operator++((Iter<true> *)&__end4.mInfo);
              cVar7.mInfo = (uint8_t *)__end4.mKeyVals;
              cVar7.mKeyVals = (NodePtr)id_value;
            }
            this_02 = ::std::
                      __shared_ptr_access<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&fingerprint);
            FontEffect::SetFingerprint(this_02,local_1f0);
            ::std::
            vector<std::shared_ptr<Rml::FontEffect_const>,std::allocator<std::shared_ptr<Rml::FontEffect_const>>>
            ::emplace_back<std::shared_ptr<Rml::FontEffect>>
                      ((vector<std::shared_ptr<Rml::FontEffect_const>,std::allocator<std::shared_ptr<Rml::FontEffect_const>>>
                        *)&font_effect_string_list.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (shared_ptr<Rml::FontEffect> *)&fingerprint);
            type.field_2._8_4_ = 0;
          }
          else {
            uVar6 = ::std::__cxx11::string::c_str();
            Log::Message(LT_WARNING,"Font-effect \'%s\' could not be instanced.",uVar6);
            this_local._7_1_ = 0;
            type.field_2._8_4_ = 1;
          }
          ::std::shared_ptr<Rml::FontEffect>::~shared_ptr
                    ((shared_ptr<Rml::FontEffect> *)&fingerprint);
        }
        else {
          StringUtilities::StripWhitespace
                    ((String *)
                     &font_effect.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(String *)&specification);
          bVar2 = ::std::__cxx11::string::empty();
          ::std::__cxx11::string::~string
                    ((string *)
                     &font_effect.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (((bVar2 ^ 0xff) & 1) == 0) goto LAB_005f0a67;
          uVar6 = ::std::__cxx11::string::c_str();
          Log::Message(LT_WARNING,"Could not parse font-effect value \'%s\'.",uVar6);
          this_local._7_1_ = 0;
          type.field_2._8_4_ = 1;
        }
        PropertyDictionary::~PropertyDictionary((PropertyDictionary *)local_190);
        ::std::__cxx11::string::~string((string *)&specification);
      }
      ::std::__cxx11::string::~string((string *)local_110);
      if (type.field_2._8_4_ != 0) goto LAB_005f0e2e;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    bVar1 = ::std::
            vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
            ::empty((vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
                     *)&font_effect_string_list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      this_local._7_1_ = 0;
      type.field_2._8_4_ = 1;
    }
    else {
      this_00 = &font_effect_string_list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_250 = (shared_ptr<const_Rml::FontEffect> *)
                  ::std::
                  vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
                  ::begin((vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
                           *)this_00);
      local_258 = (shared_ptr<const_Rml::FontEffect> *)
                  ::std::
                  vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
                  ::end((vector<std::shared_ptr<const_Rml::FontEffect>,_std::allocator<std::shared_ptr<const_Rml::FontEffect>_>_>
                         *)this_00);
      local_268 = (shared_ptr<const_Rml::FontEffect> *)
                  ::std::
                  stable_partition<__gnu_cxx::__normal_iterator<std::shared_ptr<Rml::FontEffect_const>*,std::vector<std::shared_ptr<Rml::FontEffect_const>,std::allocator<std::shared_ptr<Rml::FontEffect_const>>>>,Rml::PropertyParserFontEffect::ParseValue(Rml::Property&,std::__cxx11::string_const&,robin_hood::detail::Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>const&)const::__0>
                            (local_250,local_258);
      MakeShared<Rml::FontEffects,Rml::FontEffects>((FontEffects *)local_2a0);
      Variant::Variant<std::shared_ptr<Rml::FontEffects>,void>
                ((Variant *)(local_2a0 + 0x10),(shared_ptr<Rml::FontEffects> *)local_2a0);
      Variant::operator=(&property->value,(Variant *)(local_2a0 + 0x10));
      Variant::~Variant((Variant *)(local_2a0 + 0x10));
      ::std::shared_ptr<Rml::FontEffects>::~shared_ptr((shared_ptr<Rml::FontEffects> *)local_2a0);
      property->unit = FONTEFFECT;
      this_local._7_1_ = 1;
      type.field_2._8_4_ = 1;
    }
LAB_005f0e2e:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_a8);
    FontEffects::~FontEffects
              ((FontEffects *)
               &font_effect_string_list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PropertyParserFontEffect::ParseValue(Property& property, const String& font_effect_string_value, const ParameterMap& /*parameters*/) const
{
	// Font-effects are declared as
	//   font-effect: <font-effect-value>[, <font-effect-value> ...];
	// Where <font-effect-value> is declared with inline properties, e.g.
	//   font-effect: outline( 1px black ), ...;

	if (font_effect_string_value.empty() || font_effect_string_value == "none")
	{
		property.value = Variant();
		property.unit = Unit::UNKNOWN;
		return true;
	}

	RMLUI_ZoneScoped;

	FontEffects font_effects;

	// Make sure we don't split inside the parenthesis since they may appear in decorator shorthands.
	StringList font_effect_string_list;
	StringUtilities::ExpandString(font_effect_string_list, font_effect_string_value, ',', '(', ')');

	font_effects.value = font_effect_string_value;
	font_effects.list.reserve(font_effect_string_list.size());

	// Get or instance each decorator in the comma-separated string list
	for (const String& font_effect_string : font_effect_string_list)
	{
		const size_t shorthand_open = font_effect_string.find('(');
		const size_t shorthand_close = font_effect_string.rfind(')');
		const bool invalid_parenthesis = (shorthand_open == String::npos || shorthand_close == String::npos || shorthand_open >= shorthand_close);

		if (invalid_parenthesis)
		{
			// We found no parenthesis, font-effects can only be declared anonymously for now.
			Log::Message(Log::LT_WARNING, "Invalid syntax for font-effect '%s'.", font_effect_string.c_str());
			return false;
		}
		else
		{
			// Since we have parentheses it must be an anonymous decorator with inline properties
			const String type = StringUtilities::StripWhitespace(font_effect_string.substr(0, shorthand_open));

			// Check for valid font-effect type
			FontEffectInstancer* instancer = Factory::GetFontEffectInstancer(type);
			if (!instancer)
			{
				Log::Message(Log::LT_WARNING, "Font-effect type '%s' not found.", type.c_str());
				return false;
			}

			const String shorthand = font_effect_string.substr(shorthand_open + 1, shorthand_close - shorthand_open - 1);
			const PropertySpecification& specification = instancer->GetPropertySpecification();

			// Parse the shorthand properties given by the 'font-effect' shorthand property
			PropertyDictionary properties;
			if (!specification.ParsePropertyDeclaration(properties, "font-effect", shorthand))
			{
				// Empty values are allowed in font-effects, if the value is not empty we must have encountered a parser error.
				if (!StringUtilities::StripWhitespace(shorthand).empty())
				{
					Log::Message(Log::LT_WARNING, "Could not parse font-effect value '%s'.", font_effect_string.c_str());
					return false;
				}
			}

			// Set unspecified values to their defaults
			specification.SetPropertyDefaults(properties);

			RMLUI_ZoneScopedN("InstanceFontEffect");
			SharedPtr<FontEffect> font_effect = instancer->InstanceFontEffect(type, properties);
			if (font_effect)
			{
				// Create a unique hash value for the given type and values
				size_t fingerprint = Hash<String>{}(type);
				for (const auto& id_value : properties.GetProperties())
					Utilities::HashCombine(fingerprint, id_value.second.Get<String>());

				font_effect->SetFingerprint(fingerprint);

				font_effects.list.emplace_back(std::move(font_effect));
			}
			else
			{
				Log::Message(Log::LT_WARNING, "Font-effect '%s' could not be instanced.", font_effect_string.c_str());
				return false;
			}
		}
	}

	if (font_effects.list.empty())
		return false;

	// Partition the list such that the back layer effects appear before the front layer effects
	std::stable_partition(font_effects.list.begin(), font_effects.list.end(),
		[](const SharedPtr<const FontEffect>& effect) { return effect->GetLayer() == FontEffect::Layer::Back; });

	property.value = Variant(MakeShared<FontEffects>(std::move(font_effects)));
	property.unit = Unit::FONTEFFECT;

	return true;
}